

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O0

Byte ppmd_read(void *p)

{
  long lVar1;
  Byte *pBVar2;
  undefined8 *in_RDI;
  Byte b;
  _7zip *zip;
  archive_read *a;
  Byte local_1;
  
  lVar1 = *(long *)((archive *)*in_RDI)[0x15].archive_format_name;
  if (*(long *)(lVar1 + 0x4d78) == 0) {
    archive_set_error((archive *)*in_RDI,0x54,"Truncated RAR file data");
    *(undefined4 *)(lVar1 + 0x4da0) = 1;
    local_1 = '\0';
  }
  else {
    pBVar2 = *(Byte **)(lVar1 + 0x4d70);
    *(Byte **)(lVar1 + 0x4d70) = pBVar2 + 1;
    local_1 = *pBVar2;
    *(long *)(lVar1 + 0x4d78) = *(long *)(lVar1 + 0x4d78) + -1;
    *(long *)(lVar1 + 0x4d80) = *(long *)(lVar1 + 0x4d80) + 1;
  }
  return local_1;
}

Assistant:

static Byte
ppmd_read(void *p)
{
	struct archive_read *a = ((IByteIn*)p)->a;
	struct _7zip *zip = (struct _7zip *)(a->format->data);
	Byte b;

	if (zip->ppstream.avail_in == 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Truncated RAR file data");
		zip->ppstream.overconsumed = 1;
		return (0);
	}
	b = *zip->ppstream.next_in++;
	zip->ppstream.avail_in--;
	zip->ppstream.total_in++;
	return (b);
}